

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
SerialSimulationDataGenerator::Initialize
          (SerialSimulationDataGenerator *this,U32 simulation_sample_rate,
          SerialAnalyzerSettings *settings)

{
  U32 UVar1;
  Mode MVar2;
  U64 UVar3;
  U64 *pUVar4;
  BitState BVar5;
  U32 UVar6;
  BitState BVar7;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  ClockGenerator::Init((double)settings->mBitRate,(int)this + 0x38);
  SimulationChannelDescriptor::SetChannel((Channel *)&this->mSerialSimulationData);
  BVar7 = (BitState)&this->mSerialSimulationData;
  SimulationChannelDescriptor::SetSampleRate(BVar7);
  BVar5 = (BitState)this->mSettings->mInverted;
  this->mBitLow = BVar5;
  this->mBitHigh = BVar5 ^ BIT_HIGH;
  SimulationChannelDescriptor::SetInitialBitState(BVar7);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance(BVar7);
  this->mMpModeDataMask = 0;
  this->mNumBitsMask = 0;
  this->mValue = 0;
  this->mMpModeAddressMask = 0;
  UVar1 = this->mSettings->mBitsPerTransfer;
  if (UVar1 != 0) {
    UVar3 = 0;
    UVar6 = UVar1;
    do {
      UVar3 = UVar3 * 2 + 1;
      UVar6 = UVar6 - 1;
    } while (UVar6 != 0);
    this->mNumBitsMask = UVar3;
  }
  MVar2 = this->mSettings->mSerialMode;
  if (MVar2 == MpModeMsbZeroMeansAddress) {
    pUVar4 = &this->mMpModeDataMask;
  }
  else {
    if (MVar2 != MpModeMsbOneMeansAddress) {
      return;
    }
    pUVar4 = &this->mMpModeAddressMask;
  }
  *pUVar4 = 1L << ((byte)UVar1 & 0x3f);
  return;
}

Assistant:

void SerialSimulationDataGenerator::Initialize( U32 simulation_sample_rate, SerialAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    mClockGenerator.Init( mSettings->mBitRate, simulation_sample_rate );
    mSerialSimulationData.SetChannel( mSettings->mInputChannel );
    mSerialSimulationData.SetSampleRate( simulation_sample_rate );

    if( mSettings->mInverted == false )
    {
        mBitLow = BIT_LOW;
        mBitHigh = BIT_HIGH;
    }
    else
    {
        mBitLow = BIT_HIGH;
        mBitHigh = BIT_LOW;
    }

    mSerialSimulationData.SetInitialBitState( mBitHigh );
    mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

    mValue = 0;

    mMpModeAddressMask = 0;
    mMpModeDataMask = 0;
    mNumBitsMask = 0;

    U32 num_bits = mSettings->mBitsPerTransfer;
    for( U32 i = 0; i < num_bits; i++ )
    {
        mNumBitsMask <<= 1;
        mNumBitsMask |= 0x1;
    }

    if( mSettings->mSerialMode == SerialAnalyzerEnums::MpModeMsbOneMeansAddress )
        mMpModeAddressMask = 0x1ull << ( mSettings->mBitsPerTransfer );

    if( mSettings->mSerialMode == SerialAnalyzerEnums::MpModeMsbZeroMeansAddress )
        mMpModeDataMask = 0x1ull << ( mSettings->mBitsPerTransfer );
}